

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_set_senfh(acmod_t *acmod,FILE *logfh)

{
  int iVar1;
  
  if ((FILE *)acmod->senfh != (FILE *)0x0) {
    fclose((FILE *)acmod->senfh);
  }
  acmod->senfh = logfh;
  if (logfh != (FILE *)0x0) {
    iVar1 = acmod_write_senfh_header(acmod,logfh);
    return iVar1;
  }
  return 0;
}

Assistant:

int
acmod_set_senfh(acmod_t *acmod, FILE *logfh)
{
    if (acmod->senfh)
        fclose(acmod->senfh);
    acmod->senfh = logfh;
    if (logfh == NULL)
        return 0;
    return acmod_write_senfh_header(acmod, logfh);
}